

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall wallet::WalletInit::AddWalletOptions(WalletInit *this,ArgsManager *argsman)

{
  string *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_ea;
  allocator<char> local_e9;
  undefined1 local_e8 [8];
  string local_e0;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-addresstype",(allocator<char> *)local_e8);
  fmt = FormatOutputType_abi_cxx11_(BECH32);
  tinyformat::format<std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "What type of addresses to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\", default: \"%s\")"
             ,(char *)fmt,in_RCX);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-avoidpartialspends",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,
             "Group outputs by address, selecting many (possibly all) or none, instead of selecting on a per-output basis. Privacy is improved as addresses are mostly swept with fewer transactions and outputs are aggregated in clean change addresses. It may result in higher fees due to less optimal coin selection caused by this added limitation and possibly a larger-than-necessary number of inputs being used. Always enabled for wallets with \"avoid_reuse\" enabled, otherwise default: %u."
             ,(bool *)&DEFAULT_AVOIDPARTIALSPENDS);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-changetype",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "What type of change to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\"). Default is \"legacy\" when -addresstype=legacy, else it is an implementation detail."
             ,(allocator<char> *)(local_e8 + 7));
  pbVar1 = &local_60;
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-consolidatefeerate=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,10000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "The maximum feerate (in %s/kvB) at which transaction building may use more inputs than strictly necessary so that the wallet\'s UTXO pool can be reduced (default: %s)."
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-disablewallet",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Do not load the wallet and disable wallet RPC calls",
             (allocator<char> *)(local_e8 + 7));
  pbVar1 = &local_60;
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-discardfee=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,10000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "The fee rate (in %s/kvB) that indicates your tolerance for discarding change by adding it to the fee (default: %s). Note: An output is discarded if it is dust at this rate, but we will always discard up to the dust relay fee and a discard fee above that is limited by the fee estimate for the longest target"
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-fallbackfee=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "A fee rate (in %s/kvB) that will be used when fee estimation has insufficient data. 0 to entirely disable the fallbackfee feature. (default: %s)"
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-keypool=<n>",(allocator<char> *)local_e8);
  tinyformat::format<unsigned_int>
            (&local_40,
             "Set key pool size to <n> (default: %u). Warning: Smaller sizes may increase the risk of losing funds when restoring from an old backup, if none of the addresses in the original keypool have been used."
             ,&DEFAULT_KEYPOOL_SIZE);
  pbVar1 = &local_60;
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-maxapsfee=<n>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "Spend up to this amount in additional (absolute) fees (in %s) if it allows the use of partial spend avoidance (default: %s)"
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-maxtxfee=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,10000000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "Maximum total fees (in %s) to use in a single wallet transaction; setting this too low may abort large transactions (default: %s)"
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  local_e8._0_4_ = DEBUG_TEST;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-mintxfee=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,1000);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)
             "Fee rates (in %s/kvB) smaller than this are considered zero fee for transaction creation (default: %s)"
             ,(char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)pbVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-paytxfee=<amt>",(allocator<char> *)(local_e8 + 7));
  FormatMoney_abi_cxx11_(&local_60,0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (&local_40,
             (tinyformat *)"Fee rate (in %s/kvB) to add to transactions you send (default: %s)",
             (char *)&::CURRENCY_UNIT_abi_cxx11_,&local_60,pbVar1);
  local_e8._0_4_ = WALLET;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-signer=<cmd>",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"External signing tool, see doc/external-signer.md",
             (allocator<char> *)(local_e8 + 7));
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-spendzeroconfchange",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,"Spend unconfirmed change when sending transactions (default: %u)",
             (bool *)&DEFAULT_SPEND_ZEROCONF_CHANGE);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-txconfirmtarget=<n>",(allocator<char> *)local_e8);
  tinyformat::format<unsigned_int>
            (&local_40,
             "If paytxfee is not set, include enough fee so transactions begin confirmation on average within n blocks (default: %u)"
             ,&DEFAULT_TX_CONFIRM_TARGET);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-wallet=<path>",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Specify wallet path to load at startup. Can be used multiple times to load multiple wallets. Path is to a directory containing wallet data and log files. If the path is not absolute, it is interpreted relative to <walletdir>. This only loads existing wallets and does not create new ones. For backwards compatibility this also accepts names of existing top-level data files in <walletdir>."
             ,(allocator<char> *)(local_e8 + 7));
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,0x201,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletbroadcast",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,"Make the wallet broadcast transactions (default: %u)",
             (bool *)&DEFAULT_WALLETBROADCAST);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletdir=<dir>",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Specify directory to hold wallets (default: <datadir>/wallets if it exists, otherwise <datadir>)"
             ,(allocator<char> *)(local_e8 + 7));
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,0x201,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletnotify=<cmd>",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Execute command when a wallet transaction changes. %s in cmd is replaced by TxID, %w is replaced by wallet name, %b is replaced by the hash of the block including the transaction (set to \'unconfirmed\' if the transaction is not included) and %h is replaced by the block height (-1 if not included). %w is not currently implemented on windows. On systems where %w is supported, it should NOT be quoted because this would break shell escaping used to invoke the command."
             ,(allocator<char> *)(local_e8 + 7));
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletrbf",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,"Send transactions with full-RBF opt-in enabled (RPC only, default: %u)",
             (bool *)&DEFAULT_WALLET_RBF);
  local_60._M_dataplus._M_p._0_4_ = 2;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,1,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-dblogsize",(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"-flushwallet",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"-privdb",(allocator<char> *)(local_e8 + 7));
  std::__cxx11::string::string<std::allocator<char>>(local_80,"-swapbdbendian",&local_e9);
  __l._M_len = 4;
  __l._M_array = &local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_40,__l,&local_ea);
  ArgsManager::AddHiddenArgs
            (argsman,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_40);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-unsafesqlitesync",(allocator<char> *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Set SQLite synchronous=OFF to disable waiting for the database to sync to disk. This is unsafe and can cause data loss and corruption. This option is only used by tests to improve their performance (default: false)"
             ,(allocator<char> *)(local_e8 + 7));
  local_60._M_dataplus._M_p._0_4_ = 3;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,0x101,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletrejectlongchains",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,
             "Wallet will not create transactions that violate mempool chain limits (default: %u)",
             (bool *)&DEFAULT_WALLET_REJECT_LONG_CHAINS);
  local_60._M_dataplus._M_p._0_4_ = 3;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,0x101,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"-walletcrosschain",(allocator<char> *)local_e8);
  tinyformat::format<bool>
            (&local_40,"Allow reusing wallet files across chains (default: %u)",
             (bool *)&DEFAULT_WALLETCROSSCHAIN);
  local_60._M_dataplus._M_p._0_4_ = 3;
  ArgsManager::AddArg(argsman,&local_e0,&local_40,0x101,(OptionsCategory *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletInit::AddWalletOptions(ArgsManager& argsman) const
{
    argsman.AddArg("-addresstype", strprintf("What type of addresses to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\", default: \"%s\")", FormatOutputType(DEFAULT_ADDRESS_TYPE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-avoidpartialspends", strprintf("Group outputs by address, selecting many (possibly all) or none, instead of selecting on a per-output basis. Privacy is improved as addresses are mostly swept with fewer transactions and outputs are aggregated in clean change addresses. It may result in higher fees due to less optimal coin selection caused by this added limitation and possibly a larger-than-necessary number of inputs being used. Always enabled for wallets with \"avoid_reuse\" enabled, otherwise default: %u.", DEFAULT_AVOIDPARTIALSPENDS), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-changetype",
                   "What type of change to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\"). Default is \"legacy\" when "
                   "-addresstype=legacy, else it is an implementation detail.",
                   ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-consolidatefeerate=<amt>", strprintf("The maximum feerate (in %s/kvB) at which transaction building may use more inputs than strictly necessary so that the wallet's UTXO pool can be reduced (default: %s).", CURRENCY_UNIT, FormatMoney(DEFAULT_CONSOLIDATE_FEERATE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-disablewallet", "Do not load the wallet and disable wallet RPC calls", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-discardfee=<amt>", strprintf("The fee rate (in %s/kvB) that indicates your tolerance for discarding change by adding it to the fee (default: %s). "
                                                                "Note: An output is discarded if it is dust at this rate, but we will always discard up to the dust relay fee and a discard fee above that is limited by the fee estimate for the longest target",
                                                              CURRENCY_UNIT, FormatMoney(DEFAULT_DISCARD_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);

    argsman.AddArg("-fallbackfee=<amt>", strprintf("A fee rate (in %s/kvB) that will be used when fee estimation has insufficient data. 0 to entirely disable the fallbackfee feature. (default: %s)",
                                                               CURRENCY_UNIT, FormatMoney(DEFAULT_FALLBACK_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-keypool=<n>", strprintf("Set key pool size to <n> (default: %u). Warning: Smaller sizes may increase the risk of losing funds when restoring from an old backup, if none of the addresses in the original keypool have been used.", DEFAULT_KEYPOOL_SIZE), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-maxapsfee=<n>", strprintf("Spend up to this amount in additional (absolute) fees (in %s) if it allows the use of partial spend avoidance (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_MAX_AVOIDPARTIALSPEND_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-maxtxfee=<amt>", strprintf("Maximum total fees (in %s) to use in a single wallet transaction; setting this too low may abort large transactions (default: %s)",
        CURRENCY_UNIT, FormatMoney(DEFAULT_TRANSACTION_MAXFEE)), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-mintxfee=<amt>", strprintf("Fee rates (in %s/kvB) smaller than this are considered zero fee for transaction creation (default: %s)",
                                                            CURRENCY_UNIT, FormatMoney(DEFAULT_TRANSACTION_MINFEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-paytxfee=<amt>", strprintf("Fee rate (in %s/kvB) to add to transactions you send (default: %s)",
                                                            CURRENCY_UNIT, FormatMoney(CFeeRate{DEFAULT_PAY_TX_FEE}.GetFeePerK())), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#ifdef ENABLE_EXTERNAL_SIGNER
    argsman.AddArg("-signer=<cmd>", "External signing tool, see doc/external-signer.md", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#endif
    argsman.AddArg("-spendzeroconfchange", strprintf("Spend unconfirmed change when sending transactions (default: %u)", DEFAULT_SPEND_ZEROCONF_CHANGE), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-txconfirmtarget=<n>", strprintf("If paytxfee is not set, include enough fee so transactions begin confirmation on average within n blocks (default: %u)", DEFAULT_TX_CONFIRM_TARGET), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-wallet=<path>", "Specify wallet path to load at startup. Can be used multiple times to load multiple wallets. Path is to a directory containing wallet data and log files. If the path is not absolute, it is interpreted relative to <walletdir>. This only loads existing wallets and does not create new ones. For backwards compatibility this also accepts names of existing top-level data files in <walletdir>.", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::WALLET);
    argsman.AddArg("-walletbroadcast",  strprintf("Make the wallet broadcast transactions (default: %u)", DEFAULT_WALLETBROADCAST), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-walletdir=<dir>", "Specify directory to hold wallets (default: <datadir>/wallets if it exists, otherwise <datadir>)", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::WALLET);
#if HAVE_SYSTEM
    argsman.AddArg("-walletnotify=<cmd>", "Execute command when a wallet transaction changes. %s in cmd is replaced by TxID, %w is replaced by wallet name, %b is replaced by the hash of the block including the transaction (set to 'unconfirmed' if the transaction is not included) and %h is replaced by the block height (-1 if not included). %w is not currently implemented on windows. On systems where %w is supported, it should NOT be quoted because this would break shell escaping used to invoke the command.", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#endif
    argsman.AddArg("-walletrbf", strprintf("Send transactions with full-RBF opt-in enabled (RPC only, default: %u)", DEFAULT_WALLET_RBF), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);

#ifdef USE_BDB
    argsman.AddArg("-dblogsize=<n>", strprintf("Flush wallet database activity from memory to disk log every <n> megabytes (default: %u)", DatabaseOptions().max_log_mb), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-flushwallet", strprintf("Run a thread to flush wallet periodically (default: %u)", DEFAULT_FLUSHWALLET), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-privdb", strprintf("Sets the DB_PRIVATE flag in the wallet db environment (default: %u)", !DatabaseOptions().use_shared_memory), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-swapbdbendian", "Swaps the internal endianness of BDB wallet databases (default: false)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
#else
    argsman.AddHiddenArgs({"-dblogsize", "-flushwallet", "-privdb", "-swapbdbendian"});
#endif

#ifdef USE_SQLITE
    argsman.AddArg("-unsafesqlitesync", "Set SQLite synchronous=OFF to disable waiting for the database to sync to disk. This is unsafe and can cause data loss and corruption. This option is only used by tests to improve their performance (default: false)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
#else
    argsman.AddHiddenArgs({"-unsafesqlitesync"});
#endif

    argsman.AddArg("-walletrejectlongchains", strprintf("Wallet will not create transactions that violate mempool chain limits (default: %u)", DEFAULT_WALLET_REJECT_LONG_CHAINS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-walletcrosschain", strprintf("Allow reusing wallet files across chains (default: %u)", DEFAULT_WALLETCROSSCHAIN), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
}